

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unpack.c
# Opt level: O3

exr_result_t unpack_half_to_float_3chan_interleave_rev(exr_decode_pipeline_t *decode)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  exr_coding_channel_info_t *peVar4;
  uint uVar5;
  int iVar6;
  short *psVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  long lVar11;
  uint8_t *puVar12;
  uint uVar13;
  long lVar14;
  short *psVar15;
  
  iVar1 = (decode->chunk).height;
  if (0 < iVar1) {
    peVar4 = decode->channels;
    psVar7 = (short *)decode->unpacked_buffer;
    uVar2 = peVar4->width;
    lVar11 = (long)(int)uVar2;
    puVar12 = peVar4[2].field_12.decode_to_ptr;
    iVar3 = peVar4->user_line_stride;
    iVar8 = 0;
    do {
      if (0 < (int)uVar2) {
        lVar14 = 0;
        psVar15 = psVar7;
        do {
          uVar9 = (uint)psVar15[lVar11 * 2];
          uVar13 = (uVar9 & 0x7fff) << 0xd;
          uVar10 = uVar9 & 0x80000000;
          if (uVar13 < 0x800000) {
            if ((uVar9 & 0x7fff) != 0) {
              uVar5 = 0x1f;
              if ((uVar9 & 0x7fff) != 0) {
                for (; uVar13 >> uVar5 == 0; uVar5 = uVar5 - 1) {
                }
              }
              iVar6 = (uVar5 ^ 0x1f) - 8;
              uVar10 = (uVar10 | uVar13 << ((byte)iVar6 & 0x1f) | 0x38800000) + iVar6 * -0x800000;
            }
          }
          else if (uVar13 < 0xf800000) {
            uVar10 = (uVar10 | uVar13) + 0x38000000;
          }
          else {
            uVar10 = uVar10 | uVar13 | 0x7f800000;
          }
          *(uint *)(puVar12 + lVar14) = uVar10;
          uVar9 = (uint)psVar15[lVar11];
          uVar13 = (uVar9 & 0x7fff) << 0xd;
          uVar10 = uVar9 & 0x80000000;
          if (uVar13 < 0x800000) {
            if ((uVar9 & 0x7fff) != 0) {
              uVar5 = 0x1f;
              if ((uVar9 & 0x7fff) != 0) {
                for (; uVar13 >> uVar5 == 0; uVar5 = uVar5 - 1) {
                }
              }
              iVar6 = (uVar5 ^ 0x1f) - 8;
              uVar10 = (uVar10 | uVar13 << ((byte)iVar6 & 0x1f) | 0x38800000) + iVar6 * -0x800000;
            }
          }
          else if (uVar13 < 0xf800000) {
            uVar10 = (uVar10 | uVar13) + 0x38000000;
          }
          else {
            uVar10 = uVar10 | uVar13 | 0x7f800000;
          }
          *(uint *)(puVar12 + lVar14 + 4) = uVar10;
          uVar9 = (uint)*psVar15;
          uVar13 = (uVar9 & 0x7fff) << 0xd;
          uVar10 = uVar9 & 0x80000000;
          if (uVar13 < 0x800000) {
            if ((uVar9 & 0x7fff) != 0) {
              uVar5 = 0x1f;
              if ((uVar9 & 0x7fff) != 0) {
                for (; uVar13 >> uVar5 == 0; uVar5 = uVar5 - 1) {
                }
              }
              iVar6 = (uVar5 ^ 0x1f) - 8;
              uVar10 = (uVar10 | uVar13 << ((byte)iVar6 & 0x1f) | 0x38800000) + iVar6 * -0x800000;
            }
          }
          else if (uVar13 < 0xf800000) {
            uVar10 = (uVar10 | uVar13) + 0x38000000;
          }
          else {
            uVar10 = uVar10 | uVar13 | 0x7f800000;
          }
          *(uint *)(puVar12 + lVar14 + 8) = uVar10;
          psVar15 = psVar15 + 1;
          lVar14 = lVar14 + 0xc;
        } while ((ulong)uVar2 * 0xc != lVar14);
      }
      psVar7 = psVar7 + lVar11 * 3;
      puVar12 = puVar12 + iVar3;
      iVar8 = iVar8 + 1;
    } while (iVar8 != iVar1);
  }
  return 0;
}

Assistant:

static exr_result_t
unpack_half_to_float_3chan_interleave_rev (exr_decode_pipeline_t* decode)
{
    /* we know we're unpacking all the channels and there is no subsampling */
    const uint8_t*  srcbuffer = (const uint8_t*) decode->unpacked_buffer;
    const uint16_t *in0, *in1, *in2;
    uint8_t*        out0;
    int             w, h;
    int             linc0;

    w     = decode->channels[0].width;
    h     = decode->chunk.height;
    linc0 = decode->channels[0].user_line_stride;

    out0 = decode->channels[2].decode_to_ptr;

    /* interleaving case, we can do this! */
    for (int y = 0; y < h; ++y)
    {
        float* out = (float*) out0;

        in0 = (const uint16_t*) srcbuffer;
        in1 = in0 + w;
        in2 = in1 + w;

        srcbuffer += w * 6; // 3 * sizeof(uint16_t), avoid type conversion
        for (int x = 0; x < w; ++x)
        {
            out[0] = half_to_float (one_to_native16 (in2[x]));
            out[1] = half_to_float (one_to_native16 (in1[x]));
            out[2] = half_to_float (one_to_native16 (in0[x]));
            out += 3;
        }
        out0 += linc0;
    }
    return EXR_ERR_SUCCESS;
}